

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImplicitParam.hpp
# Opt level: O3

void __thiscall
rc::detail::ImplicitParam<rc::detail::param::CurrentPropertyContext>::ImplicitParam
          (ImplicitParam<rc::detail::param::CurrentPropertyContext> *this,ValueType value)

{
  undefined8 uVar1;
  pair<rc::detail::PropertyContext_*,_unsigned_long> local_10;
  
  uVar1 = m_stack._8_8_;
  local_10.second = (DAT_001b5b80 - ImplicitScope::m_scopes >> 3) * -0x5555555555555555;
  if (m_stack._8_8_ == m_stack._16_8_) {
    local_10.first = value;
    std::
    vector<std::pair<rc::detail::PropertyContext*,unsigned_long>,std::allocator<std::pair<rc::detail::PropertyContext*,unsigned_long>>>
    ::_M_realloc_insert<std::pair<rc::detail::PropertyContext*,unsigned_long>>
              ((vector<std::pair<rc::detail::PropertyContext*,unsigned_long>,std::allocator<std::pair<rc::detail::PropertyContext*,unsigned_long>>>
                *)m_stack,(iterator)m_stack._8_8_,&local_10);
  }
  else {
    *(ValueType *)m_stack._8_8_ = value;
    *(unsigned_long *)(uVar1 + 8) = local_10.second;
    m_stack._8_8_ = m_stack._8_8_ + 0x10;
  }
  return;
}

Assistant:

ImplicitParam<Param>::ImplicitParam(ValueType value) {
  m_stack.push(
      std::make_pair(std::move(value), ImplicitScope::m_scopes.size()));
}